

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileSwitch.cpp
# Opt level: O3

void __thiscall TileSwitch::addUpdate(TileSwitch *this,bool isCosmetic,bool noAdjacentUpdates)

{
  undefined7 in_register_00000031;
  __node_gen_type __node_gen;
  
  Tile::getBoardPtr(&this->super_Tile);
  std::
  _Hashtable<Tile*,Tile*,std::allocator<Tile*>,std::__detail::_Identity,std::equal_to<Tile*>,std::hash<Tile*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::
  _M_insert<Tile*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Tile*,false>>>>
            ();
  if ((int)CONCAT71(in_register_00000031,isCosmetic) == 0) {
    Tile::getBoardPtr(&this->super_Tile);
    std::
    _Hashtable<TileSwitch*,TileSwitch*,std::allocator<TileSwitch*>,std::__detail::_Identity,std::equal_to<TileSwitch*>,std::hash<TileSwitch*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<TileSwitch*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<TileSwitch*,false>>>>
              ();
    if (!noAdjacentUpdates) {
      Tile::_updateAdjacentTiles(&this->super_Tile);
    }
  }
  return;
}

Assistant:

void TileSwitch::addUpdate(bool isCosmetic, bool noAdjacentUpdates) {
    getBoardPtr()->cosmeticUpdates.insert(this);
    if (!isCosmetic) {
        getBoardPtr()->switchUpdates.insert(this);
        if (!noAdjacentUpdates) {
            _updateAdjacentTiles();
        }
    }
}